

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplugin_p.h
# Opt level: O0

bool __thiscall QPluginParsedMetaData::setError(QPluginParsedMetaData *this,QString *errorString)

{
  QCborValue *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  QCborValue *this_00;
  QCborValue local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_20;
  ::QCborValue::QCborValue(in_RSI,(QString *)this_00);
  ::QCborValue::operator=(this_00,in_RDI);
  ::QCborValue::~QCborValue(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool setError(const QString &errorString) Q_DECL_COLD_FUNCTION
    {
        data = errorString;
        return false;
    }